

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O2

bool __thiscall JsonModelSerialiser::saveModel(JsonModelSerialiser *this,QIODevice *destination)

{
  char cVar1;
  QTextStream writer;
  QString tempString;
  QTextStream aQStack_38 [16];
  QArrayDataPointer<char16_t> local_28;
  
  if (destination == (QIODevice *)0x0) {
    cVar1 = '\0';
  }
  else {
    local_28.d = (Data *)0x0;
    local_28.ptr = (char16_t *)0x0;
    local_28.size = 0;
    cVar1 = (**(code **)(*(long *)&(this->super_AbstractStringSerialiser).
                                   super_AbstractModelSerialiser + 0xc0))();
    if (cVar1 != '\0') {
      QTextStream::QTextStream(aQStack_38,destination);
      QTextStream::operator<<(aQStack_38,(QString *)&local_28);
      QTextStream::~QTextStream(aQStack_38);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  }
  return (bool)cVar1;
}

Assistant:

bool JsonModelSerialiser::saveModel(QIODevice *destination) const
{
    if (!destination)
        return false;
    QString tempString;
    if (!saveModel(&tempString))
        return false;
    QTextStream writer(destination);
#if (QT_VERSION < QT_VERSION_CHECK(6, 0, 0))
    writer.setCodec(textCodec());
#endif
    writer << tempString;
    return true;
}